

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O3

bool __thiscall bssl::SSLTranscript::GetHash(SSLTranscript *this,uint8_t *out,size_t *out_len)

{
  int iVar1;
  bool bVar2;
  uint len;
  ScopedEVP_MD_CTX ctx;
  uint local_44 [9];
  
  EVP_MD_CTX_init((EVP_MD_CTX *)(local_44 + 1));
  iVar1 = EVP_MD_CTX_copy_ex((EVP_MD_CTX *)(local_44 + 1),(EVP_MD_CTX *)&this->hash_);
  if (iVar1 != 0) {
    iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)(local_44 + 1),out,local_44);
    if (iVar1 != 0) {
      *out_len = (ulong)local_44[0];
      bVar2 = true;
      goto LAB_0026242b;
    }
  }
  bVar2 = false;
LAB_0026242b:
  EVP_MD_CTX_cleanup((EVP_MD_CTX *)(local_44 + 1));
  return bVar2;
}

Assistant:

bool SSLTranscript::GetHash(uint8_t *out, size_t *out_len) const {
  ScopedEVP_MD_CTX ctx;
  unsigned len;
  if (!EVP_MD_CTX_copy_ex(ctx.get(), hash_.get()) ||
      !EVP_DigestFinal_ex(ctx.get(), out, &len)) {
    return false;
  }
  *out_len = len;
  return true;
}